

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O0

void initRegularSlotDevice
               (CDevice *device,int32_t slotSize,int32_t slotCount,int pageCount,int *initialPages)

{
  byte *__s;
  CDeviceSlot *pCVar1;
  CDevicePage *pCVar2;
  CDeviceSlot *slot;
  byte *pbStack_38;
  int i;
  byte *memPtr;
  int32_t slotAddress;
  int *initialPages_local;
  int pageCount_local;
  int32_t slotCount_local;
  int32_t slotSize_local;
  CDevice *device_local;
  
  for (memPtr._4_4_ = 0; memPtr._4_4_ < slotSize * slotCount; memPtr._4_4_ = slotSize + memPtr._4_4_
      ) {
    CDevice::AddSlot(device,memPtr._4_4_,slotSize);
  }
  __s = (byte *)operator_new__((long)(slotSize * pageCount));
  memset(__s,0,(long)(slotSize * pageCount));
  device->Memory = __s;
  for (pbStack_38 = device->Memory; pbStack_38 < device->Memory + slotSize * pageCount;
      pbStack_38 = pbStack_38 + slotSize) {
    CDevice::AddPage(device,pbStack_38,slotSize);
  }
  for (slot._4_4_ = 0; slot._4_4_ < device->SlotsCount; slot._4_4_ = slot._4_4_ + 1) {
    pCVar1 = CDevice::GetSlot(device,slot._4_4_);
    pCVar2 = CDevice::GetPage(device,initialPages[slot._4_4_]);
    pCVar1->Page = pCVar2;
    pCVar1->InitialPage = (int16_t)pCVar1->Page->Number;
  }
  CDevice::SetSlot(device,device->SlotsCount + -1);
  return;
}

Assistant:

static void initRegularSlotDevice(CDevice* const device, const int32_t slotSize, const int32_t slotCount,
								  const int pageCount, const int* const initialPages) {
	for (int32_t slotAddress = 0; slotAddress < slotSize * slotCount; slotAddress += slotSize) {
		device->AddSlot(slotAddress, slotSize);
	}
	device->Memory = new byte[slotSize * pageCount]();
	for (byte* memPtr = device->Memory; memPtr < device->Memory + slotSize * pageCount; memPtr += slotSize) {
		device->AddPage(memPtr, slotSize);
	}
	for (int i = 0; i < device->SlotsCount; ++i) {
		CDeviceSlot* slot = device->GetSlot(i);
		slot->Page = device->GetPage(initialPages[i]);
		slot->InitialPage = slot->Page->Number;
	}
	device->SetSlot(device->SlotsCount - 1);
}